

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O1

ErrorData * __thiscall
duckdb::ExpressionBinder::Bind
          (ErrorData *__return_storage_ptr__,ExpressionBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr,idx_t depth,bool root_expression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  pointer pPVar4;
  type pPVar5;
  pointer pEVar6;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> this_00;
  BaseExpression *this_01;
  BoundExpression *pBVar7;
  pointer *__ptr;
  string alias;
  BindResult result;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_e8;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  idx_t local_c0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_b8;
  undefined2 local_b0;
  uint *local_a8;
  size_type local_a0;
  uint local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  uint *local_88;
  size_type local_80;
  uint local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(expr);
  local_c0 = (pPVar4->super_BaseExpression).query_location.index;
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator*(expr);
  local_e0 = local_d0;
  pcVar2 = (pPVar5->super_BaseExpression).alias._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar2,
             pcVar2 + (pPVar5->super_BaseExpression).alias._M_string_length);
  if ((pPVar5->super_BaseExpression).expression_class == BOUND_EXPRESSION) {
    ErrorData::ErrorData(__return_storage_ptr__);
  }
  else {
    (*this->_vptr_ExpressionBinder[5])(&local_b8,this,expr,depth,(ulong)root_expression);
    if ((char)local_b0 == '\x01') {
      __return_storage_ptr__->initialized = (bool)(char)local_b0;
      __return_storage_ptr__->type = local_b0._1_1_;
      paVar1 = &(__return_storage_ptr__->raw_message).field_2;
      (__return_storage_ptr__->raw_message)._M_dataplus._M_p = (pointer)paVar1;
      if (local_a8 == &local_98) {
        *(uint *)paVar1 = local_98;
        *(undefined4 *)((long)&(__return_storage_ptr__->raw_message).field_2 + 4) = uStack_94;
        *(undefined4 *)((long)&(__return_storage_ptr__->raw_message).field_2 + 8) = uStack_90;
        *(undefined4 *)((long)&(__return_storage_ptr__->raw_message).field_2 + 0xc) = uStack_8c;
      }
      else {
        (__return_storage_ptr__->raw_message)._M_dataplus._M_p = (pointer)local_a8;
        (__return_storage_ptr__->raw_message).field_2._M_allocated_capacity =
             CONCAT44(uStack_94,local_98);
      }
      (__return_storage_ptr__->raw_message)._M_string_length = local_a0;
      local_a0 = 0;
      local_98 = local_98 & 0xffffff00;
      paVar1 = &(__return_storage_ptr__->final_message).field_2;
      (__return_storage_ptr__->final_message)._M_dataplus._M_p = (pointer)paVar1;
      if (local_88 == &local_78) {
        *(uint *)paVar1 = local_78;
        *(undefined4 *)((long)&(__return_storage_ptr__->final_message).field_2 + 4) = uStack_74;
        *(undefined4 *)((long)&(__return_storage_ptr__->final_message).field_2 + 8) = uStack_70;
        *(undefined4 *)((long)&(__return_storage_ptr__->final_message).field_2 + 0xc) = uStack_6c;
      }
      else {
        (__return_storage_ptr__->final_message)._M_dataplus._M_p = (pointer)local_88;
        (__return_storage_ptr__->final_message).field_2._M_allocated_capacity =
             CONCAT44(uStack_74,local_78);
      }
      (__return_storage_ptr__->final_message)._M_string_length = local_80;
      local_80 = 0;
      local_78 = local_78 & 0xffffff00;
      local_a8 = &local_98;
      local_88 = &local_78;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&__return_storage_ptr__->extra_info,local_68);
    }
    else {
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)&local_b8);
      (pEVar6->super_BaseExpression).query_location.index = local_c0;
      this_00._M_head_impl = (ParsedExpression *)operator_new(0x40);
      local_e8._M_head_impl = local_b8._M_head_impl;
      local_b8._M_head_impl = (Expression *)0x0;
      BoundExpression::BoundExpression
                ((BoundExpression *)this_00._M_head_impl,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_e8);
      if (local_e8._M_head_impl != (Expression *)0x0) {
        (*((local_e8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      _Var3._M_head_impl =
           (expr->
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (expr->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = this_00._M_head_impl;
      if (_Var3._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
      }
      this_01 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->(expr)->super_BaseExpression;
      pBVar7 = BaseExpression::Cast<duckdb::BoundExpression>(this_01);
      ::std::__cxx11::string::_M_assign
                ((string *)&(pBVar7->super_ParsedExpression).super_BaseExpression.alias);
      if (local_d8 != 0) {
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(&pBVar7->expr);
        ::std::__cxx11::string::_M_assign((string *)&(pEVar6->super_BaseExpression).alias);
      }
      ErrorData::ErrorData(__return_storage_ptr__);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_68);
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if (local_b8._M_head_impl != (Expression *)0x0) {
      (*((local_b8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

ErrorData ExpressionBinder::Bind(unique_ptr<ParsedExpression> &expr, idx_t depth, bool root_expression) {
	// bind the node, but only if it has not been bound yet
	auto query_location = expr->GetQueryLocation();
	auto &expression = *expr;
	auto alias = expression.GetAlias();
	if (expression.GetExpressionClass() == ExpressionClass::BOUND_EXPRESSION) {
		// already bound, don't bind it again
		return ErrorData();
	}
	// bind the expression
	BindResult result = BindExpression(expr, depth, root_expression);
	if (result.HasError()) {
		return std::move(result.error);
	}
	// successfully bound: replace the node with a BoundExpression
	result.expression->SetQueryLocation(query_location);
	expr = make_uniq<BoundExpression>(std::move(result.expression));
	auto &be = expr->Cast<BoundExpression>();
	be.SetAlias(alias);
	if (!alias.empty()) {
		be.expr->SetAlias(alias);
	}
	return ErrorData();
}